

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

TestCaseGroup * vkt::image::createImageFormatReinterpretTests(TestContext *testCtx)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VkFormat format;
  VkFormat format_00;
  int iVar3;
  int iVar4;
  TestNode *this;
  TextureFormat *pTVar5;
  undefined8 *puVar6;
  TestNode *node;
  TextureFormat TVar7;
  long lVar8;
  ImageType imageType;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *extraout_RDX_02;
  undefined8 *extraout_RDX_03;
  undefined8 *extraout_RDX_04;
  undefined8 *extraout_RDX_05;
  undefined8 *extraout_RDX_06;
  undefined8 *puVar9;
  undefined8 *extraout_RDX_07;
  long lVar10;
  ulong uVar11;
  undefined8 uVar12;
  string caseName;
  TextureFormat local_e0;
  TextureFormat local_d8;
  ulong local_d0;
  TextureFormat TStack_c8;
  TestNode *local_c0;
  string local_b8;
  string local_98;
  TestContext *local_78;
  long local_70;
  string local_68;
  long local_48;
  long local_40;
  undefined8 *local_38;
  
  local_c0 = (TestNode *)operator_new(0x70);
  local_78 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_c0,testCtx,"format_reinterpret",
             "Cases with differing texture and image formats");
  paVar2 = &local_b8.field_2;
  lVar8 = 0;
  do {
    this = (TestNode *)operator_new(0x70);
    getImageTypeName_abi_cxx11_
              (&local_b8,(image *)(ulong)*(uint *)(&DAT_00d6f9ec + lVar8 * 3),imageType);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,local_78,local_b8._M_dataplus._M_p,"");
    puVar9 = extraout_RDX;
    local_48 = lVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      puVar9 = extraout_RDX_00;
    }
    local_38 = &(anonymous_namespace)::s_textures + lVar8 * 3;
    local_70 = 0;
    lVar8 = 0;
    do {
      format = (&(anonymous_namespace)::s_formats)[lVar8];
      lVar10 = 0;
      local_40 = lVar8;
      do {
        getFormatShortString_abi_cxx11_(&local_68,(image *)(ulong)format,(VkFormat)puVar9);
        pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_68);
        local_e0 = (TextureFormat)&local_d0;
        TVar7 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar7) {
          local_d0 = *(ulong *)TVar7;
          TStack_c8 = pTVar5[3];
        }
        else {
          local_d0 = *(ulong *)TVar7;
          local_e0 = *pTVar5;
        }
        local_d8 = pTVar5[1];
        *pTVar5 = TVar7;
        pTVar5[1].order = R;
        pTVar5[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar5[2].order = R;
        format_00 = *(VkFormat *)((long)&(anonymous_namespace)::s_formats + lVar10);
        getFormatShortString_abi_cxx11_(&local_98,(image *)(ulong)format_00,local_d8.order);
        uVar11 = 0xf;
        if (local_e0 != (TextureFormat)&local_d0) {
          uVar11 = local_d0;
        }
        if (uVar11 < local_98._M_string_length + (long)local_d8) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar12 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_98._M_string_length + (long)local_d8) goto LAB_0071bf47;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_0071bf47:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,(ulong)local_98._M_dataplus._M_p);
        }
        psVar1 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_b8.field_2._M_allocated_capacity = *psVar1;
          local_b8.field_2._8_8_ = puVar6[3];
          local_b8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar1;
          local_b8._M_dataplus._M_p = (pointer)*puVar6;
        }
        puVar9 = puVar6 + 1;
        local_b8._M_string_length = puVar6[1];
        *puVar6 = psVar1;
        *puVar9 = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          puVar9 = extraout_RDX_01;
        }
        if (local_e0 != (TextureFormat)&local_d0) {
          operator_delete((void *)local_e0,local_d0 + 1);
          puVar9 = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          puVar9 = extraout_RDX_03;
        }
        if (local_70 != lVar10) {
          if (format != format_00) {
            local_e0 = ::vk::mapVkFormat(format);
            iVar3 = tcu::TextureFormat::getPixelSize(&local_e0);
            local_68._M_dataplus._M_p = (pointer)::vk::mapVkFormat(format_00);
            iVar4 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_68);
            puVar9 = extraout_RDX_04;
            if (iVar3 != iVar4) goto LAB_0071c120;
          }
          node = (TestNode *)operator_new(0x98);
          local_e0 = (TextureFormat)&local_d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
          tcu::TestCase::TestCase
                    ((TestCase *)node,local_78,local_b8._M_dataplus._M_p,(char *)local_e0);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2cd08;
          node[1]._vptr_TestNode = (_func_int **)*local_38;
          *(undefined4 *)&node[1].m_testCtx = *(undefined4 *)(local_38 + 1);
          *(undefined8 *)((long)&node[1].m_testCtx + 4) = *(undefined8 *)((long)local_38 + 0xc);
          *(undefined4 *)((long)&node[1].m_name._M_dataplus._M_p + 4) =
               *(undefined4 *)((long)local_38 + 0x14);
          *(VkFormat *)&node[1].m_name._M_string_length = format_00;
          *(VkFormat *)((long)&node[1].m_name._M_string_length + 4) = format;
          *(undefined2 *)&node[1].m_name.field_2 = 1;
          node[1].m_name.field_2._M_local_buf[2] = '\0';
          tcu::TestNode::addChild(this,node);
          puVar9 = extraout_RDX_05;
          if (local_e0 != (TextureFormat)&local_d0) {
            operator_delete((void *)local_e0,local_d0 + 1);
            puVar9 = extraout_RDX_06;
          }
        }
LAB_0071c120:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          puVar9 = extraout_RDX_07;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x34);
      lVar8 = local_40 + 1;
      local_70 = local_70 + 4;
    } while (lVar8 != 0xd);
    tcu::TestNode::addChild(local_c0,this);
    lVar8 = local_48 + 1;
    if (lVar8 == 8) {
      return (TestCaseGroup *)local_c0;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageFormatReinterpretTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "format_reinterpret",	"Cases with differing texture and image formats"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));

		for (int imageFormatNdx = 0; imageFormatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++imageFormatNdx)
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			const std::string caseName = getFormatShortString(s_formats[imageFormatNdx]) + "_" + getFormatShortString(s_formats[formatNdx]);
			if (imageFormatNdx != formatNdx && formatsAreCompatible(s_formats[imageFormatNdx], s_formats[formatNdx]))
				groupByImageViewType->addChild(new LoadStoreTest(testCtx, caseName, "", texture, s_formats[formatNdx], s_formats[imageFormatNdx]));
		}
		testGroup->addChild(groupByImageViewType.release());
	}

	return testGroup.release();
}